

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void auto_compaction_snapshots_test(void)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  __atomic_base<unsigned_long> metalen;
  size_t bodylen;
  long extraout_RDX;
  fdb_kvs_handle *pfVar6;
  fdb_kvs_handle *pfVar7;
  timeval *ptVar8;
  timeval *__tv;
  fdb_config *fconfig;
  char *pcVar9;
  fdb_kvs_handle **ppfVar10;
  uint uVar11;
  uint uVar12;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  ulong uVar15;
  fdb_kvs_handle *pfVar16;
  char *pcVar17;
  fdb_kvs_handle **ppfVar18;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  btree *doc;
  filemgr_ops *pfVar19;
  fdb_config *fconfig_00;
  fdb_kvs_handle **__s;
  fdb_kvs_handle *unaff_R15;
  fdb_doc *rdoc;
  fdb_kvs_handle *snapshot;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  int num_compactions;
  char str [64];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  fdb_kvs_handle *pfStack_3360;
  fdb_kvs_handle *pfStack_3358;
  fdb_file_handle *pfStack_3350;
  fdb_iterator *pfStack_3348;
  fdb_doc *pfStack_3340;
  fdb_kvs_handle *pfStack_3338;
  timeval tStack_3330;
  fdb_kvs_config fStack_3320;
  fdb_config fStack_3308;
  fdb_config *pfStack_3210;
  fdb_kvs_handle *pfStack_3208;
  fdb_kvs_handle *pfStack_3200;
  fdb_file_handle *pfStack_31f8;
  fdb_kvs_handle *pfStack_31f0;
  char acStack_31e7 [15];
  filemgr *pfStack_31d8;
  docio_handle *pdStack_31d0;
  btreeblk_handle *pbStack_31c8;
  size_t sStack_31c0;
  filemgr *pfStack_31b8;
  docio_handle *pdStack_31b0;
  btreeblk_handle *pbStack_31a8;
  timeval tStack_31a0;
  undefined1 auStack_3190 [76];
  uint uStack_3144;
  char *pcStack_3050;
  atomic<unsigned_long> aStack_3048;
  btree *pbStack_3040;
  fdb_kvs_handle *pfStack_3038;
  fdb_kvs_handle *pfStack_3030;
  code *pcStack_3028;
  uint uStack_3014;
  fdb_txn *pfStack_3010;
  fdb_kvs_handle *pfStack_3008;
  fdb_iterator *pfStack_3000;
  fdb_snapshot_info_t *pfStack_2ff8;
  int iStack_2fec;
  fdb_kvs_handle *pfStack_2fe8;
  fdb_kvs_handle *apfStack_2fe0 [3];
  uint64_t uStack_2fc8;
  fdb_kvs_config fStack_2fc0;
  char acStack_2fa8 [8];
  timeval tStack_2fa0;
  char acStack_2f90 [256];
  btree bStack_2e90;
  char acStack_2e40 [256];
  char acStack_2d40 [256];
  fdb_config fStack_2c40;
  fdb_kvs_handle **ppfStack_2b48;
  fdb_kvs_handle **ppfStack_2b40;
  fdb_kvs_handle *pfStack_2b38;
  fdb_kvs_handle **ppfStack_2b30;
  fdb_kvs_handle *pfStack_2b28;
  code *pcStack_2b20;
  fdb_kvs_handle **ppfStack_2b18;
  fdb_kvs_handle *pfStack_2b10;
  fdb_kvs_handle *apfStack_2b08 [9];
  fdb_kvs_config fStack_2ac0;
  timeval tStack_2aa8;
  fdb_kvs_handle *apfStack_2a98 [33];
  fdb_config fStack_2990;
  fdb_kvs_handle *apfStack_2898 [32];
  fdb_kvs_handle *apfStack_2798 [32];
  fdb_kvs_handle afStack_2698 [15];
  fdb_config *pfStack_690;
  fdb_kvs_handle *pfStack_688;
  fdb_kvs_handle *pfStack_680;
  fdb_config *pfStack_678;
  fdb_kvs_handle *pfStack_670;
  fdb_kvs_handle *pfStack_668;
  fdb_kvs_handle *pfStack_658;
  fdb_file_handle *pfStack_650;
  fdb_iterator *pfStack_648;
  fdb_doc *pfStack_640;
  fdb_kvs_handle *pfStack_638;
  undefined1 auStack_62f [31];
  undefined1 auStack_610 [72];
  fdb_config fStack_5c8;
  timeval *ptStack_4d0;
  fdb_kvs_handle *pfStack_4c8;
  fdb_kvs_handle *pfStack_4c0;
  fdb_config *pfStack_4b8;
  fdb_kvs_handle *pfStack_4b0;
  int iStack_49c;
  fdb_kvs_handle *pfStack_498;
  fdb_file_handle *pfStack_490;
  pthread_t pStack_488;
  undefined1 auStack_47f [63];
  undefined1 auStack_440 [16];
  uint64_t uStack_430;
  fdb_config fStack_348;
  fdb_kvs_handle *pfStack_248;
  fdb_kvs_handle *pfStack_240;
  filemgr_ops *pfStack_238;
  fdb_kvs_handle *pfStack_230;
  fdb_kvs_handle *pfStack_228;
  timeval tStack_218;
  fdb_kvs_handle *pfStack_208;
  fdb_kvs_handle *pfStack_200;
  fdb_kvs_handle *local_1f0;
  undefined1 local_1e8 [16];
  fdb_file_handle *local_1d8;
  undefined1 local_1cc [4];
  undefined1 local_1c8 [80];
  __atomic_base<unsigned_long> local_178;
  btreeblk_handle *pbStack_170;
  __atomic_base<unsigned_long> local_168;
  fdb_kvs_info local_158;
  undefined1 local_108;
  undefined1 local_fa;
  btree *local_f0;
  code *local_d0;
  fdb_encryption_algorithm_t local_c8;
  filemgr_ops *local_c0;
  
  pfStack_200 = (fdb_kvs_handle *)0x11b6e7;
  gettimeofday((timeval *)(local_1c8 + 0x40),(__timezone_ptr_t)0x0);
  pfStack_200 = (fdb_kvs_handle *)0x11b6ec;
  memleak_start();
  pfVar19 = (filemgr_ops *)local_1cc;
  local_1cc = (undefined1  [4])0x0;
  pfStack_200 = (fdb_kvs_handle *)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar7 = (fdb_kvs_handle *)&stack0xfffffffffffffed8;
  pfStack_200 = (fdb_kvs_handle *)0x11b714;
  fdb_get_default_config();
  local_fa = 1;
  local_108 = 1;
  local_d0 = compaction_cb_count;
  local_c8 = 0x20;
  local_f0 = (btree *)0x1;
  pfVar16 = (fdb_kvs_handle *)0x156054;
  pfStack_200 = (fdb_kvs_handle *)0x11b74e;
  local_c0 = pfVar19;
  fVar2 = fdb_open(&local_1d8,"mvcc_test1",(fdb_config *)pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar7 = (fdb_kvs_handle *)local_1c8;
    pfStack_200 = (fdb_kvs_handle *)0x11b763;
    fdb_get_default_kvs_config();
    local_168._M_i = local_1c8._16_8_;
    local_178._M_i = local_1c8._0_8_;
    pbStack_170 = (btreeblk_handle *)local_1c8._8_8_;
    pfVar16 = (fdb_kvs_handle *)(local_1e8 + 8);
    pfStack_200 = (fdb_kvs_handle *)0x11b788;
    fVar2 = fdb_kvs_open_default(local_1d8,(fdb_kvs_handle **)pfVar16,(fdb_kvs_config *)&local_178);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    unaff_R13 = (fdb_kvs_handle *)0x156958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      unaff_R15 = (fdb_kvs_handle *)0xcccccccd;
      pfVar13 = (fdb_kvs_handle *)0x1565bd;
      pfVar16 = (fdb_kvs_handle *)local_1c8;
      iVar4 = (int)unaff_R12;
      pfStack_200 = (fdb_kvs_handle *)0x11b7bc;
      sprintf((char *)pfVar16,"%d",unaff_R12);
      pfVar6 = (fdb_kvs_handle *)local_1e8._8_8_;
      pfStack_200 = (fdb_kvs_handle *)0x11b7c9;
      sVar5 = strlen((char *)pfVar16);
      pfStack_200 = (fdb_kvs_handle *)0x11b7e0;
      fVar2 = fdb_set_kv(pfVar6,pfVar16,sVar5,"value",5);
      pfVar14 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_200 = (fdb_kvs_handle *)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        pfStack_200 = (fdb_kvs_handle *)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        pfVar7 = pfVar6;
        pfStack_200 = (fdb_kvs_handle *)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        pfStack_200 = (fdb_kvs_handle *)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        pfStack_200 = (fdb_kvs_handle *)0x11ba3c;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar14;
        pfVar6 = unaff_R15;
LAB_0011ba3c:
        pfVar14 = unaff_R13;
        unaff_R13 = pfVar13;
        pfStack_200 = (fdb_kvs_handle *)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        pfStack_200 = (fdb_kvs_handle *)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        pfStack_200 = (fdb_kvs_handle *)0x11ba5b;
        pfVar16 = pfVar7;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        pfStack_200 = (fdb_kvs_handle *)0x11ba60;
        auto_compaction_snapshots_test();
        unaff_RBP = unaff_R13;
        unaff_R15 = pfVar6;
LAB_0011ba60:
        unaff_R13 = pfVar14;
        pfStack_200 = (fdb_kvs_handle *)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        pfVar19 = (filemgr_ops *)local_1c8;
        pfStack_200 = (fdb_kvs_handle *)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      pfVar6 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar4) {
        pfVar16 = (fdb_kvs_handle *)0x0;
        pfStack_200 = (fdb_kvs_handle *)0x11b80c;
        fVar2 = fdb_commit(local_1d8,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      pfVar7 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar4) {
        pfStack_200 = (fdb_kvs_handle *)0x11b83d;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)local_1e8._8_8_,&local_158);
        pfVar7 = (fdb_kvs_handle *)local_158.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        pfStack_200 = (fdb_kvs_handle *)0x11b85f;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)local_1e8._8_8_,(fdb_kvs_handle **)local_1e8,
                                  local_158.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        pfStack_200 = (fdb_kvs_handle *)0x11b885;
        fdb_doc_create((fdb_doc **)&local_1f0,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        local_1f0->fhandle = (fdb_file_handle *)pfVar7;
        pfStack_200 = (fdb_kvs_handle *)0x11b898;
        fVar2 = fdb_get_byseq((fdb_kvs_handle *)local_1e8._0_8_,(fdb_doc *)local_1f0);
        pfVar14 = local_1f0;
        pfVar6 = unaff_R15;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        unaff_R15 = (fdb_kvs_handle *)local_1f0->op_stats;
        pfStack_200 = (fdb_kvs_handle *)0x11b8b9;
        sVar5 = strlen(local_1c8);
        pfStack_200 = (fdb_kvs_handle *)0x11b8c7;
        iVar3 = bcmp(unaff_R15,local_1c8,sVar5);
        pfVar6 = unaff_R15;
        if (iVar3 != 0) goto LAB_0011ba41;
        pfStack_200 = (fdb_kvs_handle *)0x11b8d7;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_200 = (fdb_kvs_handle *)0x11b8e1;
        fVar2 = fdb_kvs_close((fdb_kvs_handle *)local_1e8._0_8_);
        pfVar13 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        pfVar16 = (fdb_kvs_handle *)local_1e8;
        pfStack_200 = (fdb_kvs_handle *)0x11b8ff;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)local_1e8._8_8_,(fdb_kvs_handle **)pfVar16,
                                  0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        pfStack_200 = (fdb_kvs_handle *)0x11b925;
        fdb_doc_create((fdb_doc **)&local_1f0,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        local_1f0->fhandle = (fdb_file_handle *)pfVar7;
        pfStack_200 = (fdb_kvs_handle *)0x11b938;
        pfVar16 = local_1f0;
        fVar2 = fdb_get_byseq((fdb_kvs_handle *)local_1e8._0_8_,(fdb_doc *)local_1f0);
        pfVar6 = local_1f0;
        unaff_RBP = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        pfVar7 = (fdb_kvs_handle *)local_1f0->op_stats;
        pfVar16 = (fdb_kvs_handle *)local_1c8;
        pfStack_200 = (fdb_kvs_handle *)0x11b956;
        sVar5 = strlen((char *)pfVar16);
        pfStack_200 = (fdb_kvs_handle *)0x11b964;
        iVar3 = bcmp(pfVar7,pfVar16,sVar5);
        if (iVar3 != 0) goto LAB_0011ba4e;
        pfStack_200 = (fdb_kvs_handle *)0x11b974;
        fdb_doc_free((fdb_doc *)pfVar6);
        pfStack_200 = (fdb_kvs_handle *)0x11b97e;
        fVar2 = fdb_kvs_close((fdb_kvs_handle *)local_1e8._0_8_);
        unaff_R15 = (fdb_kvs_handle *)0xcccccccd;
        unaff_RBP = (fdb_kvs_handle *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      pfVar19 = (filemgr_ops *)local_1c8;
      unaff_R15 = (fdb_kvs_handle *)0xcccccccd;
      unaff_RBP = (fdb_kvs_handle *)0x1565bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 100000);
    pfStack_200 = (fdb_kvs_handle *)0x11b9b0;
    fVar2 = fdb_close(local_1d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    pfStack_200 = (fdb_kvs_handle *)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_200 = (fdb_kvs_handle *)0x11b9ca;
      memleak_end();
      pfStack_200 = (fdb_kvs_handle *)0x11b9e4;
      sprintf(local_1c8,"auto compaction completed %d times with snapshots",(ulong)(uint)local_1cc);
      pcVar17 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_200 = (fdb_kvs_handle *)0x11ba11;
      fprintf(_stderr,pcVar17,local_1c8);
      return;
    }
  }
  else {
LAB_0011ba6a:
    pfStack_200 = (fdb_kvs_handle *)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    pfStack_200 = (fdb_kvs_handle *)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    pfStack_200 = (fdb_kvs_handle *)0x11ba79;
    auto_compaction_snapshots_test();
  }
  pfStack_200 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar14 = (fdb_kvs_handle *)((ulong)pfVar16 & 0xffffffff);
  __tv = &tStack_218;
  pfStack_228 = (fdb_kvs_handle *)0x11ba95;
  pfStack_208 = pfVar7;
  pfStack_200 = unaff_RBP;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar16 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&local_1f0->kvs_config = *(int *)&local_1f0->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_228 = (fdb_kvs_handle *)0x11bab4;
    compaction_cb_count();
  }
  pfStack_228 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_4b0 = (fdb_kvs_handle *)0x11bad9;
  pfStack_248 = unaff_R12;
  pfStack_240 = unaff_R13;
  pfStack_238 = pfVar19;
  pfStack_230 = unaff_R15;
  pfStack_228 = pfVar14;
  gettimeofday((timeval *)(auStack_47f + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_4b0 = (fdb_kvs_handle *)0x11bade;
  memleak_start();
  iStack_49c = 10000;
  if (__tv != (timeval *)0x0) goto LAB_0011be6f;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bafb;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_4b0 = (fdb_kvs_handle *)0x11bb08;
  fdb_get_default_config();
  fconfig_00 = &fStack_348;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bb20;
  memcpy(fconfig_00,auStack_440,0xf8);
  fStack_348.block_reusing_threshold = 0;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bb3f;
  fVar2 = fdb_open(&pfStack_490,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_4b0 = (fdb_kvs_handle *)0x11bb54;
    fdb_get_default_kvs_config();
    auStack_47f._39_8_ = uStack_430;
    auStack_47f._23_8_ = auStack_440._0_8_;
    auStack_47f._31_8_ = auStack_440._8_8_;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bb76;
    fVar2 = fdb_kvs_open_default(pfStack_490,&pfStack_498,(fdb_kvs_config *)(auStack_47f + 0x17));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
    if (0 < iStack_49c) {
      unaff_R13 = (fdb_kvs_handle *)0x1;
      __tv = (timeval *)CONCAT71((int7)((ulong)auStack_440 >> 8),1);
      uVar12 = 0;
      do {
        uVar11 = uVar12 + 1;
        pfVar14 = (fdb_kvs_handle *)(ulong)uVar11;
        pfStack_4b0 = (fdb_kvs_handle *)0x11bbb0;
        sprintf(auStack_47f,"%d",pfVar14);
        unaff_R12 = pfStack_498;
        pfStack_4b0 = (fdb_kvs_handle *)0x11bbbd;
        sVar5 = strlen(auStack_47f);
        pfStack_4b0 = (fdb_kvs_handle *)0x11bbd8;
        fVar2 = fdb_set_kv(unaff_R12,auStack_47f,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pfStack_4b0 = (fdb_kvs_handle *)0x11be65;
          rollback_during_ops_test();
          goto LAB_0011be65;
        }
        ptVar8 = __tv;
        if ((int)((ulong)unaff_R13 / 10) * 10 - 1U == uVar12) {
          ptVar8 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
          pfStack_4b0 = (fdb_kvs_handle *)0x11bc18;
          fdb_commit(pfStack_490,~(byte)__tv & 1);
        }
        unaff_R13 = (fdb_kvs_handle *)(ulong)((int)unaff_R13 + 1);
        __tv = ptVar8;
        uVar12 = uVar11;
      } while ((int)uVar11 < iStack_49c);
    }
    pfVar14 = (fdb_kvs_handle *)0x1;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bc3f;
    fdb_commit(pfStack_490,'\x01');
    pfStack_4b0 = (fdb_kvs_handle *)0x11bc4e;
    fdb_get_kvs_info(pfStack_498,(fdb_kvs_info *)auStack_440);
    __tv = (timeval *)(auStack_440 + 8);
    if ((fdb_config *)auStack_440._8_8_ != (fdb_config *)(long)iStack_49c) {
      pfStack_4b0 = (fdb_kvs_handle *)0x11bc6a;
      rollback_during_ops_test();
    }
    pfStack_4b0 = (fdb_kvs_handle *)0x11bc82;
    pthread_create(&pStack_488,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_49c);
    fconfig_00 = (fdb_config *)0x156958;
    unaff_R15 = (fdb_kvs_handle *)auStack_47f;
    unaff_R12 = (fdb_kvs_handle *)0x1565bd;
    do {
      pfStack_4b0 = (fdb_kvs_handle *)0x11bca4;
      sprintf((char *)unaff_R15,"%d",pfVar14);
      unaff_R13 = pfStack_498;
      pfStack_4b0 = (fdb_kvs_handle *)0x11bcb1;
      sVar5 = strlen((char *)unaff_R15);
      pfStack_4b0 = (fdb_kvs_handle *)0x11bcc8;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
        pfStack_4b0 = (fdb_kvs_handle *)0x11bce4;
        fVar2 = fdb_commit(pfStack_490,'\x01');
        if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
        goto LAB_0011be6a;
      }
      uVar12 = (int)pfVar14 + 1;
      pfVar14 = (fdb_kvs_handle *)(ulong)uVar12;
    } while (uVar12 != 0x2711);
    pfStack_4b0 = (fdb_kvs_handle *)0x11bd0a;
    pthread_join(pStack_488,(void **)(auStack_47f + 0xf));
    pfStack_4b0 = (fdb_kvs_handle *)0x11bd2d;
    fVar2 = fdb_set_kv(pfStack_498,"key1",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bd44;
    fVar2 = fdb_commit(pfStack_490,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bd5e;
    fdb_get_kvs_info(pfStack_498,(fdb_kvs_info *)auStack_440);
    fconfig_00 = (fdb_config *)auStack_440._8_8_;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bd85;
    fVar2 = fdb_set_kv(pfStack_498,"key2",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bdb0;
    fVar2 = fdb_set_kv(pfStack_498,"key3",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bdc7;
    fVar2 = fdb_commit(pfStack_490,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bddc;
    fVar2 = fdb_rollback(&pfStack_498,(fdb_seqnum_t)fconfig_00);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_4b0 = (fdb_kvs_handle *)0x11bdf6;
      fdb_get_kvs_info(pfStack_498,(fdb_kvs_info *)auStack_440);
      if ((fdb_config *)auStack_440._8_8_ != fconfig_00) {
        pfStack_4b0 = (fdb_kvs_handle *)0x11be07;
        rollback_during_ops_test();
      }
      pfStack_4b0 = (fdb_kvs_handle *)0x11be11;
      fdb_close(pfStack_490);
      pfStack_4b0 = (fdb_kvs_handle *)0x11be16;
      fdb_shutdown();
      pfStack_4b0 = (fdb_kvs_handle *)0x11be1b;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (rollback_during_ops_test(void*)::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_4b0 = (fdb_kvs_handle *)0x11be4c;
      fprintf(_stderr,pcVar17,"rollback during ops test");
      return;
    }
  }
  else {
    pfStack_4b0 = (fdb_kvs_handle *)0x11bf9d;
    rollback_during_ops_test();
LAB_0011bf9d:
    __tv = (timeval *)auStack_440;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bfa2;
    rollback_during_ops_test();
LAB_0011bfa2:
    pfStack_4b0 = (fdb_kvs_handle *)0x11bfa7;
    rollback_during_ops_test();
LAB_0011bfa7:
    pfStack_4b0 = (fdb_kvs_handle *)0x11bfac;
    rollback_during_ops_test();
LAB_0011bfac:
    pfStack_4b0 = (fdb_kvs_handle *)0x11bfb1;
    rollback_during_ops_test();
LAB_0011bfb1:
    pfStack_4b0 = (fdb_kvs_handle *)0x11bfb6;
    rollback_during_ops_test();
LAB_0011bfb6:
    pfStack_4b0 = (fdb_kvs_handle *)0x11bfbb;
    rollback_during_ops_test();
  }
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfc0;
  rollback_during_ops_test();
LAB_0011bfc0:
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfc5;
  rollback_during_ops_test();
  goto LAB_0011bfc5;
LAB_0011c266:
  pfStack_668 = (fdb_kvs_handle *)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_2b20 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_2b20 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_2b20 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_2b20 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_2b20 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_2b20 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_2b20 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_3028 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_3200 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_3200 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011be65:
  pfStack_4b0 = (fdb_kvs_handle *)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  pfStack_4b0 = (fdb_kvs_handle *)0x11be6f;
  rollback_during_ops_test();
LAB_0011be6f:
  fconfig_00 = (fdb_config *)auStack_440;
  pfStack_4b0 = (fdb_kvs_handle *)0x11be7c;
  fdb_get_default_config();
  unaff_R15 = (fdb_kvs_handle *)&fStack_348;
  pfStack_4b0 = (fdb_kvs_handle *)0x11be94;
  memcpy(unaff_R15,fconfig_00,0xf8);
  fStack_348.block_reusing_threshold = 0;
  pfStack_4b0 = (fdb_kvs_handle *)0x11beb3;
  fVar2 = fdb_open(&pfStack_490,"mvcc_test1",(fdb_config *)unaff_R15);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
  fconfig_00 = (fdb_config *)auStack_440;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bec8;
  fdb_get_default_kvs_config();
  auStack_47f._39_8_ = uStack_430;
  auStack_47f._23_8_ = auStack_440._0_8_;
  auStack_47f._31_8_ = auStack_440._8_8_;
  pfStack_4b0 = (fdb_kvs_handle *)0x11beeb;
  fVar2 = fdb_kvs_open_default(pfStack_490,&pfStack_498,(fdb_kvs_config *)(auStack_47f + 0x17));
  if (fVar2 == FDB_RESULT_SUCCESS) {
    iStack_49c = (int)__tv->tv_sec;
    if (1 < (long)iStack_49c) {
      unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
      fconfig_00 = (fdb_config *)0x156958;
      unaff_R15 = (fdb_kvs_handle *)auStack_47f;
      unaff_R12 = (fdb_kvs_handle *)0x1565bd;
      __tv = (timeval *)(long)iStack_49c;
      do {
        pfStack_4b0 = (fdb_kvs_handle *)0x11bf2c;
        sprintf((char *)unaff_R15,"%d",(ulong)__tv & 0xffffffff);
        pfVar14 = pfStack_498;
        pfStack_4b0 = (fdb_kvs_handle *)0x11bf39;
        sVar5 = strlen((char *)unaff_R15);
        pfStack_4b0 = (fdb_kvs_handle *)0x11bf50;
        fVar2 = fdb_set_kv(pfVar14,unaff_R15,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
        if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
          pfStack_4b0 = (fdb_kvs_handle *)0x11bf76;
          fVar2 = fdb_rollback(&pfStack_498,(fdb_seqnum_t)__tv);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
        }
        bVar1 = 2 < (long)__tv;
        __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
      } while (bVar1);
    }
    pfStack_4b0 = (fdb_kvs_handle *)0x11bf91;
    fdb_close(pfStack_490);
    pfStack_4b0 = (fdb_kvs_handle *)0x11bf98;
    pthread_exit((void *)0x0);
  }
LAB_0011bfc5:
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  pfStack_4b0 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_668 = (fdb_kvs_handle *)0x11bff0;
  ptStack_4d0 = __tv;
  pfStack_4c8 = unaff_R12;
  pfStack_4c0 = unaff_R13;
  pfStack_4b8 = fconfig_00;
  pfStack_4b0 = unaff_R15;
  gettimeofday((timeval *)(auStack_62f + 0xf),(__timezone_ptr_t)0x0);
  pfStack_668 = (fdb_kvs_handle *)0x11bff5;
  memleak_start();
  pfStack_668 = (fdb_kvs_handle *)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &fStack_5c8;
  pfStack_668 = (fdb_kvs_handle *)0x11c011;
  fdb_get_default_config();
  pfStack_668 = (fdb_kvs_handle *)0x11c025;
  fVar2 = fdb_open(&pfStack_650,"mvcc_test1",fconfig);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig = (fdb_config *)(auStack_610 + 0x30);
    pfStack_668 = (fdb_kvs_handle *)0x11c03d;
    fdb_get_default_kvs_config();
    pfStack_668 = (fdb_kvs_handle *)0x11c04f;
    fVar2 = fdb_kvs_open_default(pfStack_650,&pfStack_658,(fdb_kvs_config *)fconfig);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig = (fdb_config *)0x1;
    fconfig_00 = (fdb_config *)0x156958;
    unaff_R15 = (fdb_kvs_handle *)auStack_62f;
    unaff_R12 = (fdb_kvs_handle *)0x1565bd;
    do {
      pfStack_668 = (fdb_kvs_handle *)0x11c07e;
      sprintf((char *)unaff_R15,"%d",fconfig);
      unaff_R13 = pfStack_658;
      pfStack_668 = (fdb_kvs_handle *)0x11c08b;
      sVar5 = strlen((char *)unaff_R15);
      pfStack_668 = (fdb_kvs_handle *)0x11c0a2;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_668 = (fdb_kvs_handle *)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar12 = (int)fconfig + 1;
      fconfig = (fdb_config *)(ulong)uVar12;
    } while (uVar12 != 4);
    pfStack_668 = (fdb_kvs_handle *)0x11c0bd;
    fdb_commit(pfStack_650,'\0');
    pfStack_668 = (fdb_kvs_handle *)0x11c0e0;
    fVar2 = fdb_set_kv(pfStack_658,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    pfStack_668 = (fdb_kvs_handle *)0x11c10b;
    fVar2 = fdb_set_kv(pfStack_658,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    pfStack_668 = (fdb_kvs_handle *)0x11c122;
    fVar2 = fdb_commit(pfStack_650,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    pfStack_668 = (fdb_kvs_handle *)0x11c139;
    fVar2 = fdb_rollback(&pfStack_658,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig = (fdb_config *)auStack_610;
    pfStack_668 = (fdb_kvs_handle *)0x11c153;
    fdb_get_kvs_info(pfStack_658,(fdb_kvs_info *)fconfig);
    if (auStack_610._8_8_ != 3) {
      pfStack_668 = (fdb_kvs_handle *)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    pfStack_668 = (fdb_kvs_handle *)0x11c17a;
    fVar2 = fdb_snapshot_open(pfStack_658,&pfStack_638,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    pfStack_668 = (fdb_kvs_handle *)0x11c1a2;
    fdb_iterator_init(pfStack_638,&pfStack_648,(void *)0x0,0,(void *)0x0,0,0);
    fconfig = (fdb_config *)&pfStack_640;
    pfStack_640 = (fdb_doc *)0x0;
    fconfig_00 = (fdb_config *)0x3;
    do {
      pfStack_668 = (fdb_kvs_handle *)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_648,(fdb_doc **)fconfig);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      pfStack_668 = (fdb_kvs_handle *)0x11c1d3;
      fdb_doc_free(pfStack_640);
      pfStack_640 = (fdb_doc *)0x0;
      pfStack_668 = (fdb_kvs_handle *)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_648);
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_00 == (fdb_config *)0x0) {
      pfStack_668 = (fdb_kvs_handle *)0x11c201;
      fdb_iterator_close(pfStack_648);
      pfStack_668 = (fdb_kvs_handle *)0x11c20b;
      fdb_kvs_close(pfStack_638);
      pfStack_668 = (fdb_kvs_handle *)0x11c215;
      fdb_close(pfStack_650);
      pfStack_668 = (fdb_kvs_handle *)0x11c21a;
      fdb_shutdown();
      pfStack_668 = (fdb_kvs_handle *)0x11c21f;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_668 = (fdb_kvs_handle *)0x11c250;
      fprintf(_stderr,pcVar17,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c26b:
    pfStack_668 = (fdb_kvs_handle *)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    pfStack_668 = (fdb_kvs_handle *)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    pfStack_668 = (fdb_kvs_handle *)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    pfStack_668 = (fdb_kvs_handle *)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    pfStack_668 = (fdb_kvs_handle *)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    pfStack_668 = (fdb_kvs_handle *)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    pfStack_668 = (fdb_kvs_handle *)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  pfStack_668 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_2b20 = (code *)0x11c2b0;
  pfStack_690 = fconfig;
  pfStack_688 = unaff_R12;
  pfStack_680 = unaff_R13;
  pfStack_678 = fconfig_00;
  pfStack_670 = unaff_R15;
  pfStack_668 = pfVar14;
  gettimeofday(&tStack_2aa8,(__timezone_ptr_t)0x0);
  pcStack_2b20 = (code *)0x11c2b5;
  memleak_start();
  pcStack_2b20 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2b20 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_2b20 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_2990.wal_threshold = 0x400;
  fStack_2990.compaction_mode = 0;
  fStack_2990.durability_opt = 2;
  pfVar7 = (fdb_kvs_handle *)(apfStack_2798 + 0x20);
  ppfVar10 = apfStack_2a98;
  pcVar17 = "kvs%d";
  uVar15 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_2b20 = (code *)0x11c31b;
    sprintf((char *)ppfVar10,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar9 = (char *)(apfStack_2b08 + (long)__s);
    pcStack_2b20 = (code *)0x11c336;
    ppfVar18 = (fdb_kvs_handle **)pcVar9;
    fVar2 = fdb_open((fdb_file_handle **)pcVar9,(char *)ppfVar10,
                     (fdb_config *)(apfStack_2a98 + 0x21));
    iVar4 = (int)ppfVar18;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar18 = (fdb_kvs_handle **)0x0;
    ppfStack_2b18 = __s;
    pfStack_2b10 = pfVar7;
    do {
      __s = ppfVar18;
      pcStack_2b20 = (code *)0x11c35b;
      sprintf((char *)ppfVar10,"kvs%d",(ulong)(uint)((int)__s + (int)uVar15));
      pfVar16 = *(fdb_kvs_handle **)pcVar9;
      pcStack_2b20 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar16,(fdb_kvs_handle **)pfVar7,(char *)ppfVar10,
                           (fdb_kvs_config *)(apfStack_2b08 + 9));
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_2b20 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp;
      ppfVar18 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_2b18 + 1);
    uVar15 = uVar15 + 0x80;
    pfVar7 = (fdb_kvs_handle *)&pfStack_2b10[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_2a98 + 0x40;
  ppfVar10 = apfStack_2798;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    uVar15 = 0;
    do {
      pcStack_2b20 = (code *)0x11c3cf;
      sprintf((char *)__s,"key%08d",uVar15);
      pcStack_2b20 = (code *)0x11c3e2;
      sprintf((char *)ppfVar10,"value%08d",uVar15);
      pcVar17 = (char *)apfStack_2798[(long)&pfVar7->op_stats];
      pcStack_2b20 = (code *)0x11c3f2;
      sVar5 = strlen((char *)__s);
      pcVar9 = (char *)(sVar5 + 1);
      pcStack_2b20 = (code *)0x11c3fe;
      sVar5 = strlen((char *)ppfVar10);
      pcStack_2b20 = (code *)0x11c413;
      pfVar16 = (fdb_kvs_handle *)pcVar17;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar17,__s,(size_t)pcVar9,ppfVar10,sVar5 + 1);
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar12 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
  } while (pfVar7 != (fdb_kvs_handle *)0x400);
  pcVar9 = (char *)0x0;
  do {
    pfVar16 = apfStack_2b08[(long)pcVar9];
    if (((ulong)pcVar9 & 1) == 0) {
      pcStack_2b20 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar16,'\0');
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_2b20 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar16,'\x01');
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar9 = (char *)((long)pcVar9 + 1);
  } while (pcVar9 != (char *)0x8);
  pcVar9 = "key%08d";
  __s = apfStack_2a98 + 0x40;
  ppfVar10 = (fdb_kvs_handle **)0x0;
  do {
    uVar15 = 0;
    do {
      pcStack_2b20 = (code *)0x11c488;
      sprintf((char *)__s,"key%08d",uVar15);
      pfVar7 = apfStack_2798[(long)(ppfVar10 + 4)];
      pcStack_2b20 = (code *)0x11c498;
      sVar5 = strlen((char *)__s);
      pcStack_2b20 = (code *)0x11c4a7;
      pfVar16 = pfVar7;
      fVar2 = fdb_del_kv(pfVar7,__s,sVar5 + 1);
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar12 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar12;
    } while (uVar12 != 10);
    ppfVar10 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
  } while (ppfVar10 != (fdb_kvs_handle **)0x400);
  pcVar9 = (char *)0x0;
  do {
    pfVar16 = apfStack_2b08[(long)pcVar9];
    if (((ulong)pcVar9 & 1) == 0) {
      pcStack_2b20 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar16,'\0');
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_2b20 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar16,'\x01');
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar9 = (char *)((long)pcVar9 + 1);
  } while (pcVar9 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar9 = (char *)(apfStack_2798 + 0x20);
  do {
    pcStack_2b20 = (code *)0x11c515;
    ppfVar18 = (fdb_kvs_handle **)pcVar9;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar9,10);
    iVar4 = (int)ppfVar18;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    __s = __s + 8;
    pcVar9 = (char *)((long)pcVar9 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar10 = apfStack_2b08;
  pcVar9 = "kvs%d";
  __s = apfStack_2a98;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfVar16 = apfStack_2798[(long)&pfVar7->op_stats];
    pcStack_2b20 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar16);
    iVar4 = (int)pfVar16;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_2b20 = (code *)0x11c56d;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar7 & 0xffffffff);
    pfVar16 = *ppfVar10;
    pcStack_2b20 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar16,(char *)__s);
    iVar4 = (int)pfVar16;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->config).wal_threshold;
    ppfVar10 = ppfVar10 + 1;
  } while (pfVar7 != (fdb_kvs_handle *)0x400);
  pcVar9 = (char *)0x0;
  do {
    pfVar16 = apfStack_2b08[(long)pcVar9];
    if (((ulong)pcVar9 & 1) == 0) {
      pcStack_2b20 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar16,'\0');
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_2b20 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar16,'\x01');
      iVar4 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar9 = (char *)((long)pcVar9 + 1);
  } while (pcVar9 != (char *)0x8);
  pcVar9 = "mvcc_test_compact%d";
  __s = apfStack_2a98;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_2b20 = (code *)0x11c5eb;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar7 & 0xffffffff);
    pfVar16 = apfStack_2b08[(long)pfVar7];
    pcStack_2b20 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar16,(char *)__s);
    iVar4 = (int)pfVar16;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
  } while (pfVar7 != (fdb_kvs_handle *)0x8);
  pcVar9 = (char *)0x0;
  pcStack_2b20 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar16 = apfStack_2b08[(long)pcVar9];
    pcStack_2b20 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar16);
    iVar4 = (int)pfVar16;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar9 = (char *)((long)pcVar9 + 1);
    if (pcVar9 == (char *)0x8) {
      pcStack_2b20 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_2b20 = (code *)0x11c633;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pcStack_2b20 = (code *)0x11c664;
      fprintf(_stderr,pcVar17,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_2b20 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_2b20 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_2b20 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_2b20 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_2b20 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_2b20 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_2b20 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_3028 = (code *)0x11c6e3;
  ppfStack_2b48 = (fdb_kvs_handle **)pcVar9;
  ppfStack_2b40 = ppfVar10;
  pfStack_2b38 = (fdb_kvs_handle *)pcVar17;
  ppfStack_2b30 = __s;
  pfStack_2b28 = pfVar7;
  pcStack_2b20 = (code *)uVar15;
  gettimeofday(&tStack_2fa0,(__timezone_ptr_t)0x0);
  pcStack_3028 = (code *)0x11c6e8;
  memleak_start();
  pcStack_3028 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_3028 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_2c40.flags = 1;
  fStack_2c40.block_reusing_threshold = 0;
  fStack_2c40.seqtree_opt = 0;
  pcStack_3028 = (code *)0x11c728;
  fStack_2c40.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_3028 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_3010,"./mvcc_test1",(fdb_config *)(acStack_2d40 + 0x100));
  iStack_2fec = iVar4;
  if (iVar4 == 0) {
    pcStack_3028 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_3010,apfStack_2fe0,&fStack_2fc0);
    pcVar17 = (char *)0x1;
  }
  else {
    ppfVar10 = apfStack_2fe0;
    uVar15 = 0;
    do {
      pcStack_3028 = (code *)0x11c76d;
      sprintf(acStack_2fa8,"kv%d",uVar15 & 0xffffffff);
      pcStack_3028 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_3010,ppfVar10,acStack_2fa8,&fStack_2fc0);
      uVar15 = uVar15 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar15 != 3);
    pcVar17 = (char *)0x3;
  }
  uStack_3014 = 0;
  do {
    uVar15 = 0;
    do {
      pcStack_3028 = (code *)0x11c7d4;
      sprintf(acStack_2e40,"key%d",uVar15 & 0xffffffff);
      pcStack_3028 = (code *)0x11c7f5;
      sprintf(acStack_2f90,"meta-%d-%d",(ulong)uStack_3014,uVar15 & 0xffffffff);
      pcStack_3028 = (code *)0x11c814;
      sprintf(acStack_2d40,"body-%d-%d",(ulong)uStack_3014,uVar15 & 0xffffffff);
      doc = (btree *)(&bStack_2e90.ksize + uVar15 * 8);
      pcStack_3028 = (code *)0x11c827;
      sVar5 = strlen(acStack_2e40);
      pcStack_3028 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_2f90);
      pcStack_3028 = (code *)0x11c842;
      bodylen = strlen(acStack_2d40);
      pcStack_3028 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,acStack_2e40,sVar5,acStack_2f90,metalen._M_i,acStack_2d40,
                     bodylen);
      pfVar7 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_3028 = (code *)0x11c878;
        fdb_set(apfStack_2fe0[(long)pfVar7],*(fdb_doc **)doc);
        pfVar7 = (fdb_kvs_handle *)((long)pfVar7 + 1);
      } while ((fdb_kvs_handle *)pcVar17 != pfVar7);
      pcStack_3028 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_2e90.ksize + uVar15 * 8));
      uVar15 = uVar15 + 1;
    } while (uVar15 != 10);
    pcStack_3028 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_3010,~(byte)uStack_3014 & 1);
    uStack_3014 = uStack_3014 + 1;
    pcVar9 = (char *)(ulong)uStack_3014;
  } while (uStack_3014 != 5);
  pcStack_3028 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_3010,&pfStack_2ff8,&uStack_2fc8);
  pfVar16 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_3028 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_2fe0,(pfStack_2ff8[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_3008 = (fdb_kvs_handle *)0x0;
    pcVar9 = acStack_2d40;
    pfVar16 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_3028 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_2fe0[(long)pfVar16],&pfStack_2fe8,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_3028 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_3028 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_3028 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_3028 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_3028 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_2fe8,&pfStack_3000,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_3028 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_3028 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_3000,(fdb_doc **)&pfStack_3008);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_3028 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_3028 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_3028 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_3028 = (code *)0x11c98b;
        sprintf(acStack_2e40,"key%d",metalen._M_i);
        if (pfVar16 == (fdb_kvs_handle *)0x0) {
          pcStack_3028 = (code *)0x11c9da;
          sprintf(acStack_2f90,"meta-1-%d",metalen._M_i);
          pcStack_3028 = (code *)0x11c9ee;
          sprintf(pcVar9,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_3028 = (code *)0x11c9ae;
          sprintf(acStack_2f90,"meta-%d-%d",4,metalen._M_i);
          pcStack_3028 = (code *)0x11c9c7;
          sprintf(pcVar9,"body-%d-%d",4);
        }
        pfVar7 = pfStack_3008;
        doc = (btree *)pfStack_3008->op_stats;
        pcStack_3028 = (code *)0x11ca0a;
        iVar4 = bcmp(doc,acStack_2e40,*(size_t *)&pfStack_3008->kvs_config);
        if (iVar4 != 0) {
          pcStack_3028 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc = pfVar7->staletree;
        pcStack_3028 = (code *)0x11ca2a;
        iVar4 = bcmp(doc,acStack_2f90,(size_t)(pfVar7->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cba4;
        doc = (pfVar7->field_6).seqtree;
        pcStack_3028 = (code *)0x11ca45;
        iVar4 = bcmp(doc,pcVar9,(size_t)(pfVar7->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011cb94;
        pcStack_3028 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar7);
        pfStack_3008 = (fdb_kvs_handle *)0x0;
        uVar12 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar12;
        pcStack_3028 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_3000);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar12 != 10) goto LAB_0011cbbe;
      pcStack_3028 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_3000);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_3028 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_2fe8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
    } while (pfVar16 != (fdb_kvs_handle *)pcVar17);
    pcVar9 = (char *)0x0;
    do {
      pcStack_3028 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_2fe0[(long)pcVar9]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar9 = pcVar9 + 1;
    } while (pcVar17 != pcVar9);
    pcStack_3028 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_3010,pfStack_2ff8[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_3028 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_2ff8,uStack_2fc8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_3028 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_3010);
      pcStack_3028 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_3028 = (code *)0x11cb10;
      memleak_end();
      pcVar17 = "single kv mode:";
      if ((char)iStack_2fec != '\0') {
        pcVar17 = "multiple kv mode:";
      }
      pcStack_3028 = (code *)0x11cb40;
      sprintf(acStack_2d40,"rollback without seqtree in %s",pcVar17);
      pcVar17 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pcStack_3028 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar17,acStack_2d40);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_3028 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_3028 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_3028 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_3028 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_3200 = (fdb_kvs_handle *)0x11cc03;
  pcStack_3050 = pcVar9;
  aStack_3048.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_3040 = doc;
  pfStack_3038 = pfVar7;
  pfStack_3030 = pfVar16;
  pcStack_3028 = (code *)pcVar17;
  gettimeofday(&tStack_31a0,(__timezone_ptr_t)0x0);
  pfStack_3200 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_3200 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar17 = auStack_3190 + 0x48;
  pfStack_3200 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_3200 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_31f8,"./mvcc_test2",(fdb_config *)pcVar17);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar17 = auStack_3190;
    pfStack_3200 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_31a8 = (btreeblk_handle *)auStack_3190._16_8_;
    pfStack_31b8 = (filemgr *)auStack_3190._0_8_;
    pdStack_31b0 = (docio_handle *)auStack_3190._8_8_;
    pfStack_3200 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_31f8,&pfStack_31f0,(fdb_kvs_config *)&pfStack_31b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_3200 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_31f8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar17 = "key%d";
    pfVar7 = (fdb_kvs_handle *)acStack_31e7;
    pfVar16 = (fdb_kvs_handle *)0x1565bd;
    uVar15 = 0;
    do {
      pfStack_3200 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar7,"key%d",uVar15);
      pfVar14 = pfStack_31f0;
      pfStack_3200 = (fdb_kvs_handle *)0x11ccbb;
      sVar5 = strlen((char *)pfVar7);
      pfStack_3200 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(pfVar14,pfVar7,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_3200 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar12 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfStack_3200 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_31f8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_3200 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_31f8,"./mvcc_test3");
    pfStack_3200 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_31f8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar17 = "key%d";
    pfVar7 = (fdb_kvs_handle *)acStack_31e7;
    uVar12 = 0;
    do {
      pfStack_3200 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar7,"key%d",(ulong)uVar12);
      pfVar16 = pfStack_31f0;
      pfStack_3200 = (fdb_kvs_handle *)0x11cd47;
      sVar5 = strlen((char *)pfVar7);
      pfStack_3200 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar16,pfVar7,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 10);
    pfStack_3200 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_31f8,(fdb_file_info *)auStack_3190);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar17 = (char *)((ulong)auStack_3190._40_8_ / (ulong)uStack_3144);
    pfStack_3200 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_31f8);
    pfStack_3200 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_3200 = (fdb_kvs_handle *)0x11cdbe;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_3144 * (long)pcVar17,
                       (ulong)((uStack_3144 >> 2) + uStack_3144 * 2));
    if (iVar4 < 0) goto LAB_0011cf90;
    pfStack_3200 = (fdb_kvs_handle *)0x11cde8;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar17 * 4 + 8) * (ulong)uStack_3144,
                       (ulong)(uStack_3144 >> 2));
    if (iVar4 < 0) goto LAB_0011cf95;
    pfStack_3200 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_31f8,"./mvcc_test3",(fdb_config *)(auStack_3190 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar17 = (char *)&pfStack_31d8;
    pfStack_3200 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_31a8 = pbStack_31c8;
    pfStack_31b8 = pfStack_31d8;
    pdStack_31b0 = pdStack_31d0;
    pfStack_3200 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_31f8,&pfStack_31f0,(fdb_kvs_config *)&pfStack_31b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_3200 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_31f8,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar12 = 0;
      do {
        pfStack_3200 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_31e7,"key%d",(ulong)uVar12);
        pfVar16 = pfStack_31f0;
        pfStack_3200 = (fdb_kvs_handle *)0x11ce85;
        sVar5 = strlen(acStack_31e7);
        pfStack_3200 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar16,acStack_31e7,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 10);
      pfStack_3200 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_31f8);
      pfVar16 = (fdb_kvs_handle *)&pfStack_31d8;
      uVar12 = 0;
      while( true ) {
        pfStack_3200 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_31e7,"key%d",(ulong)uVar12);
        pfVar7 = pfStack_31f0;
        pfStack_3200 = (fdb_kvs_handle *)0x11cedf;
        sVar5 = strlen(acStack_31e7);
        pfStack_3200 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar7,acStack_31e7,sVar5,(void **)pfVar16,&sStack_31c0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_3200 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_31d8);
        uVar12 = uVar12 + 1;
        if (uVar12 == 10) {
          pfStack_3200 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_31f8);
          pfStack_3200 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_3200 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pfStack_3200 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar17,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar7 = (fdb_kvs_handle *)acStack_31e7;
      pcVar17 = "key%d";
      pfStack_3200 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_3200 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_3200 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_3200 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_3210 = (fdb_config *)pcVar17;
  pfStack_3208 = pfVar7;
  pfStack_3200 = pfVar16;
  gettimeofday(&tStack_3330,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_3340 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_3350,"./mvcc_test1",&fStack_3308);
  fdb_kvs_open_default(pfStack_3350,&pfStack_3338,&fStack_3320);
  fdb_kvs_open(pfStack_3350,&pfStack_3358,"kv",&fStack_3320);
  fVar2 = fdb_set_kv(pfStack_3358,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_3358,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_3350,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_3358,&pfStack_3360,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_3360,&pfStack_3348,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_3360);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_3358);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_3350,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_3348,&pfStack_3340);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_3340);
    fVar2 = fdb_iterator_close(pfStack_3348);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_3360);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_3338);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_3350);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar17 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar17,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void auto_compaction_snapshots_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs, *snapshot;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    fdb_kvs_info info;
    fdb_doc *rdoc;
    int num_compactions = 0;
    char str[64];

    int i, r;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // Open Database File
    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.compaction_cb = compaction_cb_count;
    config.compaction_cb_ctx = &num_compactions;
    config.compaction_cb_mask = FDB_CS_COMPLETE;
    config.compactor_sleep_duration=1;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Open KV Store
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Several kv pairs
    for(i=0;i<100000;i++) {
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Every 10 Commit
        if (i % 10 == 0) {
            status = fdb_commit(file, FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        // Every 100 iterations Get Seq/Snapshot
        if (i % 100 == 0) {
            status = fdb_get_kvs_info(kvs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            seqnum = info.last_seqnum;
            // Open durable snapshot in the midst of compaction..
            status = fdb_snapshot_open(kvs, &snapshot, seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // Open in-memory snapshot and verify content
            status = fdb_snapshot_open(kvs, &snapshot, FDB_SNAPSHOT_INMEM);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_close(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(str, "auto compaction completed %d times with snapshots",
            num_compactions);
    TEST_RESULT(str);
}